

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdSkel.cc
# Opt level: O0

bool tinyusdz::BuildSkelTopology
               (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *joints,
               vector<int,_std::allocator<int>_> *dst,string *err)

{
  ulong uVar1;
  undefined8 uVar2;
  bool bVar3;
  mapped_type_conflict2 mVar4;
  int iVar5;
  size_type sVar6;
  const_reference pvVar7;
  string *psVar8;
  reference pvVar9;
  mapped_type_conflict2 *pmVar10;
  reference pvVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  ulong local_288;
  size_t i_2;
  ulong uStack_278;
  anon_class_1_0_00000001 GetParentIndex;
  size_t i_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  pathMap;
  string local_238 [32];
  string local_218;
  undefined1 local_1f8 [8];
  string _err;
  string local_1d0;
  string local_1b0;
  int local_190;
  allocator local_189;
  string local_188 [32];
  string local_168;
  allocator local_141;
  string local_140;
  undefined1 local_120 [8];
  Path p;
  size_t i;
  undefined1 local_40 [8];
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> paths;
  string *err_local;
  vector<int,_std::allocator<int>_> *dst_local;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *joints_local;
  
  paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)err;
  bVar3 = ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::empty(joints);
  if (bVar3) {
    joints_local._7_1_ = 1;
  }
  else {
    sVar6 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                      ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)joints);
    ::std::allocator<tinyusdz::Path>::allocator((allocator<tinyusdz::Path> *)((long)&i + 7));
    ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::vector
              ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_40,sVar6,
               (allocator_type *)((long)&i + 7));
    ::std::allocator<tinyusdz::Path>::~allocator((allocator<tinyusdz::Path> *)((long)&i + 7));
    p._valid = false;
    p._201_7_ = 0;
    while( true ) {
      uVar2 = p._200_8_;
      sVar6 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                        ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)joints);
      if (sVar6 <= (ulong)uVar2) break;
      pvVar7 = ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator[]
                         (joints,p._200_8_);
      psVar8 = Token::str_abi_cxx11_(pvVar7);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_140,"",&local_141);
      Path::Path((Path *)local_120,psVar8,&local_140);
      ::std::__cxx11::string::~string((string *)&local_140);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_141);
      bVar3 = Path::is_valid((Path *)local_120);
      if (bVar3) {
        bVar3 = Path::is_root_path((Path *)local_120);
        if (bVar3) {
          if (paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      ((string *)&local_1d0,
                       "joints[{}] Root Prim path \'/\' cannot be used for joint Prim path.",
                       (allocator *)(_err.field_2._M_local_buf + 0xf));
            fmt::format<unsigned_long>(&local_1b0,&local_1d0,(unsigned_long *)&p._valid);
            ::std::__cxx11::string::operator+=
                      ((string *)
                       paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&local_1b0);
            ::std::__cxx11::string::~string((string *)&local_1b0);
            ::std::__cxx11::string::~string((string *)&local_1d0);
            ::std::allocator<char>::~allocator((allocator<char> *)(_err.field_2._M_local_buf + 0xf))
            ;
          }
          joints_local._7_1_ = 0;
          local_190 = 1;
        }
        else {
          ::std::__cxx11::string::string((string *)local_1f8);
          bVar3 = pathutil::ValidatePrimPath((Path *)local_120,(string *)local_1f8);
          if (bVar3) {
            pvVar9 = ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator[]
                               ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_40,
                                p._200_8_);
            Path::operator=(pvVar9,(Path *)local_120);
            local_190 = 0;
          }
          else {
            if (paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_238,"joints[{}] is not a valid Prim path: `{}`, reason = {}",
                         (allocator *)
                         ((long)&pathMap._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
              pvVar7 = ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator[]
                                 (joints,p._200_8_);
              psVar8 = Token::str_abi_cxx11_(pvVar7);
              in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8
              ;
              fmt::format<unsigned_long,std::__cxx11::string,std::__cxx11::string>
                        (&local_218,(fmt *)local_238,(string *)&p._valid,(unsigned_long *)psVar8,
                         in_R8,in_R9);
              ::std::__cxx11::string::operator+=
                        ((string *)
                         paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&local_218);
              ::std::__cxx11::string::~string((string *)&local_218);
              ::std::__cxx11::string::~string(local_238);
              ::std::allocator<char>::~allocator
                        ((allocator<char> *)
                         ((long)&pathMap._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
            }
            joints_local._7_1_ = 0;
            local_190 = 1;
          }
          ::std::__cxx11::string::~string((string *)local_1f8);
        }
      }
      else {
        if (paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_188,"joints[{}] is invalid Prim path: `{}`",&local_189);
          pvVar7 = ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator[]
                             (joints,p._200_8_);
          psVar8 = Token::str_abi_cxx11_(pvVar7);
          fmt::format<unsigned_long,std::__cxx11::string>
                    (&local_168,(fmt *)local_188,(string *)&p._valid,(unsigned_long *)psVar8,in_R8);
          ::std::__cxx11::string::operator+=
                    ((string *)
                     paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&local_168);
          ::std::__cxx11::string::~string((string *)&local_168);
          ::std::__cxx11::string::~string(local_188);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_189);
        }
        joints_local._7_1_ = 0;
        local_190 = 1;
      }
      Path::~Path((Path *)local_120);
      if (local_190 != 0) goto LAB_009ce3b9;
      p._200_8_ = p._200_8_ + 1;
    }
    ::std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           *)&i_1);
    uStack_278 = 0;
    while( true ) {
      uVar1 = uStack_278;
      sVar6 = std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::size
                        ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_40);
      if (sVar6 <= uVar1) break;
      mVar4 = (mapped_type_conflict2)uStack_278;
      pvVar9 = ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator[]
                         ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_40,
                          uStack_278);
      psVar8 = Path::prim_part_abi_cxx11_(pvVar9);
      pmVar10 = ::std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                              *)&i_1,psVar8);
      *pmVar10 = mVar4;
      uStack_278 = uStack_278 + 1;
    }
    sVar6 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                      ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)joints);
    ::std::vector<int,_std::allocator<int>_>::resize(dst,sVar6);
    local_288 = 0;
    while( true ) {
      sVar6 = std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::size
                        ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_40);
      if (sVar6 <= local_288) break;
      pvVar9 = ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator[]
                         ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_40,
                          local_288);
      iVar5 = BuildSkelTopology::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)((long)&i_2 + 7),
                         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                          *)&i_1,pvVar9);
      pvVar11 = ::std::vector<int,_std::allocator<int>_>::operator[](dst,local_288);
      *pvVar11 = iVar5;
      local_288 = local_288 + 1;
    }
    joints_local._7_1_ = 1;
    local_190 = 1;
    ::std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            *)&i_1);
LAB_009ce3b9:
    ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
              ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_40);
  }
  return (bool)(joints_local._7_1_ & 1);
}

Assistant:

bool BuildSkelTopology(
  const std::vector<value::token> &joints,
  std::vector<int> &dst,
  std::string *err) {

  if (joints.empty()) {
    return true;
  }

  std::vector<Path> paths(joints.size());
  for (size_t i = 0; i < joints.size(); i++) {
    Path p = Path(joints[i].str(), "");

    if (!p.is_valid()) {
      if (err) {
        (*err) += fmt::format("joints[{}] is invalid Prim path: `{}`", i, joints[i].str());
      }
      return false;
    }

    if (p.is_root_path()) {
      if (err) {
        (*err) += fmt::format("joints[{}] Root Prim path '/' cannot be used for joint Prim path.", i);
      }
      return false;
    }

    std::string _err;

    if (!pathutil::ValidatePrimPath(p, &_err)) {
      if (err) {
        (*err) += fmt::format("joints[{}] is not a valid Prim path: `{}`, reason = {}", i, joints[i].str(), _err);
      }
      return false;
    }
    
    paths[i] = p;
  }

  // path name <-> index map
  std::map<std::string, int> pathMap;
  for (size_t i = 0; i < paths.size(); i++) {
    pathMap[paths[i].prim_part()] = int(i); 
  }

  auto GetParentIndex = [](const std::map<std::string, int> &_pathMap, const Path &path) -> int {
    if (path.is_root_path()) {
      return -1;
    }
  
    // from pxrUSD's comment...
    //
    // Recurse over all ancestor paths, not just the direct parent.
    // For instance, if the map includes only paths 'a' and 'a/b/c',
    // 'a' will be treated as the parent of 'a/b/c'.
    //
    Path parentPath = path.get_parent_prim_path();
     
    uint32_t kMaxRec = 1024 * 128; // to avoid infinite loop.

    uint32_t depth = 0;
    while (parentPath.is_valid() && !parentPath.is_root_path()) {

      if (_pathMap.count(parentPath.prim_part())) {
        return _pathMap.at(parentPath.prim_part());
      } else {
      }

      parentPath = parentPath.get_parent_prim_path();
      depth++;

      if (depth >= kMaxRec) {
        // TODO: Report error
        return -1;
      } 
    }

    return -1;
  };

  dst.resize(joints.size());
  for (size_t i = 0; i < paths.size(); i++) {
    dst[i] = GetParentIndex(pathMap, paths[i]);
  }

  return true;
}